

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,double kappa,double delta,double theta,double obj_amp)

{
  int iVar1;
  row_iterator prVar2;
  default_cost_type<double> *this_00;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> prVar3;
  double dVar4;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *x_00;
  bool bVar5;
  int k_00;
  int r_size_00;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> *pprVar6;
  __tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_> *pprVar7;
  type prVar8;
  type psVar9;
  pointer prVar10;
  pointer prVar11;
  type pbVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool local_151;
  int local_94;
  int selected;
  double pi_change;
  int i;
  int r_size;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  undefined1 auStack_60 [4];
  int k;
  bool local_49;
  double dStack_48;
  bool at_least_one_pi_changed;
  double obj_amp_local;
  double theta_local;
  double delta_local;
  double kappa_local;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *last_local;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *first_local;
  bit_array *x_local;
  solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  *this_local;
  
  local_49 = false;
  dStack_48 = obj_amp;
  obj_amp_local = theta;
  theta_local = delta;
  delta_local = kappa;
  kappa_local = (double)last;
  last_local = first;
  first_local = (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *)x;
  x_local = (bit_array *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,
             "push-update-row {} {} {}\n");
  debug_logger<true>::log<double,double,double>
            ((debug_logger<true> *)this,_auStack_60,&delta_local,&theta_local,&obj_amp_local);
  do {
    bVar5 = std::
            operator==<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                      (first,last);
    if (((bVar5 ^ 0xffU) & 1) == 0) {
      return (bool)(local_49 & 1);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        *)&it.
                           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                           .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>,
                       first);
    k_00 = constraint<std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                     ((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                       *)&it.
                          super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>);
    sparse_matrix<int>::row((sparse_matrix<int> *)&i,(int)this + 0x10);
    pprVar6 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    prVar2 = *pprVar6;
    pprVar7 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
    ::decrease_preference
              ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                *)this,prVar2,*pprVar7,obj_amp_local);
    pprVar6 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    prVar2 = *pprVar6;
    pprVar7 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    r_size_00 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                ::compute_reduced_costs<baryonyx::bit_array>
                          ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                            *)this,prVar2,*pprVar7,(bit_array *)first_local);
    for (pi_change._0_4_ = 0; dVar4 = dStack_48, pi_change._0_4_ != r_size_00;
        pi_change._0_4_ = pi_change._0_4_ + 1) {
      this_00 = *(default_cost_type<double> **)(this + 0x168);
      pprVar6 = std::
                get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                            *)&i);
      prVar3 = *pprVar6;
      prVar8 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x60),(long)pi_change._0_4_);
      auVar13._0_8_ =
           default_cost_type<double>::operator()
                     (this_00,prVar3[prVar8->id].column,(bit_array *)first_local);
      prVar8 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x60),(long)pi_change._0_4_);
      auVar13._8_8_ = 0;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar4;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = prVar8->value;
      auVar13 = vfmadd213sd_fma(auVar13,auVar14,auVar15);
      prVar8->value = auVar13._0_8_;
    }
    psVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::subsolver_type[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::subsolver_type[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::subsolver_type[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::subsolver_type[]>_>
                           *)(this + 0x68),(long)k_00);
    switch(*psVar9) {
    case branch_and_bound:
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                       *)(this + 0x60));
      prVar11 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                       *)(this + 0x60));
      calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>
                (prVar10,prVar11 + r_size_00,*(random_engine **)(this + 8));
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      iVar1 = pbVar12->min;
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      local_94 = branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::
                 solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[]>>>
                           ((branch_and_bound_solver<baryonyx::itm::maximize_tag,double> *)
                            (this + 0x80),
                            (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                             *)(this + 0x60),r_size_00,iVar1,pbVar12->max);
      break;
    case exhaustive:
      local_94 = exhaustive_solver<baryonyx::itm::maximize_tag,double>::
                 solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[]>>>
                           ((exhaustive_solver<baryonyx::itm::maximize_tag,double> *)(this + 0xf0),
                            k_00,(unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                                  *)(this + 0x60),r_size_00);
      break;
    case unconstrained_branch_and_bound:
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                       *)(this + 0x60));
      prVar11 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                       *)(this + 0x60));
      calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>
                (prVar10,prVar11 + r_size_00,*(random_engine **)(this + 8));
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      iVar1 = pbVar12->min;
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      local_94 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                 ::select_variables((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                                     *)this,r_size_00,iVar1,pbVar12->max);
      if (local_94 == -2) {
        pbVar12 = std::
                  unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                  ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                                *)(this + 0x70),(long)k_00);
        iVar1 = pbVar12->min;
        pbVar12 = std::
                  unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                  ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                                *)(this + 0x70),(long)k_00);
        local_94 = branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[]>>>
                             ((branch_and_bound_solver<baryonyx::itm::maximize_tag,double> *)
                              (this + 0x80),
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                               *)(this + 0x60),r_size_00,iVar1,pbVar12->max);
      }
      break;
    case unconstrained_exhaustive:
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                       *)(this + 0x60));
      prVar11 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                       *)(this + 0x60));
      calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>
                (prVar10,prVar11 + r_size_00,*(random_engine **)(this + 8));
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      iVar1 = pbVar12->min;
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      local_94 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                 ::select_variables((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                                     *)this,r_size_00,iVar1,pbVar12->max);
      if (local_94 == -2) {
        local_94 = exhaustive_solver<baryonyx::itm::maximize_tag,double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data[]>>>
                             ((exhaustive_solver<baryonyx::itm::maximize_tag,double> *)(this + 0xf0)
                              ,k_00,(unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                                     *)(this + 0x60),r_size_00);
      }
      break;
    case linear:
    default:
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                       *)(this + 0x60));
      prVar11 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                ::get((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::rc_data[]>_>
                       *)(this + 0x60));
      calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>::rc_data*>
                (prVar10,prVar11 + r_size_00,*(random_engine **)(this + 8));
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      iVar1 = pbVar12->min;
      pbVar12 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
                              *)(this + 0x70),(long)k_00);
      local_94 = solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                 ::select_variables_101
                           ((solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                             *)this,r_size_00,iVar1,pbVar12->max);
    }
    x_00 = first_local;
    pprVar6 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    bVar5 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                      (this,(bit_array *)x_00,*pprVar6,k_00,local_94,r_size_00,delta_local,
                       theta_local);
    local_151 = (local_49 & 1U) != 0 || (double)bVar5 != 0.0;
    local_49 = local_151;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(first);
  } while( true );
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            Float pi_change;
            int selected;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
            default:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }